

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

void __thiscall
amrex::AmrLevel::setPhysBoundaryValues
          (AmrLevel *this,FArrayBox *dest,int state_indx,Real time,int dest_comp,int src_comp,
          int num_comp)

{
  bool bVar1;
  StateData *this_00;
  BaseFab<double> *in_RSI;
  long in_RDI;
  int in_stack_00000100;
  int in_stack_00000104;
  Geometry *in_stack_00000108;
  Real in_stack_00000110;
  FArrayBox *in_stack_00000118;
  Box *in_stack_00000120;
  StateData *in_stack_00000128;
  int in_stack_00000178;
  int in_stack_0000017c;
  RealBox *in_stack_00000180;
  Real *in_stack_00000188;
  Real in_stack_00000190;
  FArrayBox *in_stack_00000198;
  StateData *in_stack_000001a0;
  int in_stack_00000370;
  int in_stack_00000390;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *in_stack_ffffffffffffffa0;
  
  this_00 = Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                      (in_stack_ffffffffffffffa0,
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  StateData::descriptor(this_00);
  bVar1 = StateDescriptor::hasBndryFuncFab((StateDescriptor *)0x13976c1);
  if (bVar1) {
    Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              (in_stack_ffffffffffffffa0,
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    BaseFab<double>::box(in_RSI);
    StateData::FillBoundary
              (in_stack_00000128,in_stack_00000120,in_stack_00000118,in_stack_00000110,
               in_stack_00000108,in_stack_00000104,in_stack_00000100,in_stack_00000390);
  }
  else {
    Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              (in_stack_ffffffffffffffa0,
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    CoordSys::CellSize((CoordSys *)(in_RDI + 0x10));
    Geometry::ProbDomain((Geometry *)(in_RDI + 0x10));
    StateData::FillBoundary
              (in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_00000188,
               in_stack_00000180,in_stack_0000017c,in_stack_00000178,in_stack_00000370);
  }
  return;
}

Assistant:

void
AmrLevel::setPhysBoundaryValues (FArrayBox& dest,
                                 int        state_indx,
                                 Real       time,
                                 int        dest_comp,
                                 int        src_comp,
                                 int        num_comp)
{
    // Call the Fab interface if available.
    if (state[state_indx].descriptor()->hasBndryFuncFab()) {
        state[state_indx].FillBoundary(dest.box(), dest, time, geom, dest_comp, src_comp, num_comp);
    }
    else {
        state[state_indx].FillBoundary(dest,time,geom.CellSize(),
                                       geom.ProbDomain(),dest_comp,src_comp,num_comp);
    }
}